

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

void __thiscall cppcms::url_dispatcher::assign(url_dispatcher *this,string *expr,handler1 *h,int p1)

{
  _data *p_Var1;
  option *this_00;
  regex arStack_98 [8];
  value_type local_90;
  string local_80 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_60;
  string local_40 [32];
  
  p_Var1 = (this->d).ptr_;
  std::__cxx11::string::string(local_80,(string *)expr);
  this_00 = (option *)operator_new(0xa0);
  std::__cxx11::string::string(local_40,local_80);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_60,h);
  booster::regex::regex(arStack_98,local_40,0);
  anon_unknown_0::option::option(this_00,arStack_98);
  booster::regex::~regex(arStack_98);
  this_00->_vptr_option = (_func_int **)&PTR__base_handler_002b3f18;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&this_00[1].match_.end_,&local_60);
  *(int *)&this_00[1]._vptr_option = p1;
  *(undefined8 *)((long)&this_00[1]._vptr_option + 4) = 0;
  *(undefined8 *)&this_00[1].field_0xc = 0;
  *(undefined4 *)((long)&this_00[1].match_.begin_ + 4) = 0;
  local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002b3f58;
  local_90.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__cxx11::string::~string(local_40);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&p_Var1->options,&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.
              super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void url_dispatcher::assign(std::string const &expr,handler1 h,int p1)
	{
		d->options.push_back(make_handler(expr,h,p1));
	}